

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int __thiscall ON_String::ReverseFind(ON_String *this,char utf8_single_byte_c)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ON_Internal_Empty_aString *pOVar6;
  char *pcVar7;
  
  pOVar6 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
  if (this->m_s == (char *)0x0) {
    pOVar6 = &empty_astring;
  }
  if (((pOVar6->header).string_length < 1) ||
     (iVar3 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c), iVar3 == 0)) {
LAB_005b7082:
    uVar4 = 0xffffffff;
  }
  else {
    pcVar2 = this->m_s;
    pOVar6 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc);
    if (pcVar2 == (char *)0x0) {
      pOVar6 = &empty_astring;
    }
    uVar5 = (ulong)(pOVar6->header).string_length;
    pcVar7 = pcVar2 + uVar5;
    do {
      if (pcVar7 <= pcVar2) goto LAB_005b7082;
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar7 + -1;
    } while (*pcVar1 != utf8_single_byte_c);
  }
  return uVar4;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}